

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

region * __thiscall
toml::detail::character_in_range::scan
          (region *__return_storage_ptr__,character_in_range *this,location *loc)

{
  element_type *peVar1;
  byte bVar2;
  location first;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (((loc->location_ <
        (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) &&
      (bVar2 = location::current(loc), this->from_ <= bVar2)) && (bVar2 <= this->to_)) {
    location::location(&first,loc);
    location::advance(loc,1);
    region::region(__return_storage_ptr__,&first,loc);
    location::~location(&first);
    return __return_storage_ptr__;
  }
  region::region(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region character_in_range::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    const auto curr = loc.current();
    if(this->from_ <= curr && curr <= this->to_)
    {
        const auto first = loc;
        loc.advance(1);
        return region(first, loc);
    }
    return region{};
}